

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

Gia_ManTer_t * Gia_ManTerSimulate(Gia_Man_t *pAig,int fVerbose)

{
  int iVar1;
  abctime aVar2;
  Gia_ManTer_t *p_00;
  uint *puVar3;
  uint *Entry;
  abctime aVar4;
  abctime clkTotal;
  abctime clk;
  int Counter;
  int i;
  uint *pLoop;
  uint *pPrev;
  uint *pState;
  Gia_ManTer_t *p;
  int fVerbose_local;
  Gia_Man_t *pAig_local;
  
  aVar2 = Abc_Clock();
  iVar1 = Gia_ManRegNum(pAig);
  if (0 < iVar1) {
    Abc_Clock();
    p_00 = Gia_ManTerCreate(pAig);
    Gia_ManTerSimInfoInit(p_00);
    puVar3 = Gia_ManTerStateCreate(p_00);
    Gia_ManTerStateInsert(puVar3,p_00->nStateWords,p_00->pBins,p_00->nBins);
    pLoop = (uint *)0x0;
    clk._4_4_ = 0;
    while( true ) {
      Gia_ManTerSimulateRound(p_00);
      Gia_ManTerSimInfoTransfer(p_00);
      puVar3 = Gia_ManTerStateCreate(p_00);
      Entry = Gia_ManTerStateLookup(puVar3,p_00->nStateWords,p_00->pBins,p_00->nBins);
      if (Entry != (uint *)0x0) break;
      Gia_ManTerStateInsert(puVar3,p_00->nStateWords,p_00->pBins,p_00->nBins);
      if ((p_00->nIters <= clk._4_4_) && (clk._4_4_ % 10 == 0)) {
        Gia_ManTerRetire(p_00,puVar3,pLoop);
      }
      clk._4_4_ = clk._4_4_ + 1;
      pLoop = puVar3;
    }
    iVar1 = Vec_PtrSize(p_00->vStates);
    pAig->nTerStates = iVar1;
    iVar1 = Vec_PtrFind(p_00->vStates,Entry);
    pAig->nTerLoop = iVar1;
    if (fVerbose != 0) {
      printf("Ternary simulation saturated after %d iterations. ",(ulong)(clk._4_4_ + 1));
      Abc_Print(1,"%s =","Time");
      aVar4 = Abc_Clock();
      Abc_Print(1,"%9.2f sec\n",((double)(aVar4 - aVar2) * 1.0) / 1000000.0);
    }
    return p_00;
  }
  __assert_fail("Gia_ManRegNum(pAig) > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaTsim.c"
                ,0x2a2,"Gia_ManTer_t *Gia_ManTerSimulate(Gia_Man_t *, int)");
}

Assistant:

Gia_ManTer_t * Gia_ManTerSimulate( Gia_Man_t * pAig, int fVerbose )
{
    Gia_ManTer_t * p;
    unsigned * pState, * pPrev, * pLoop;
    int i, Counter;
    abctime clk, clkTotal = Abc_Clock();
    assert( Gia_ManRegNum(pAig) > 0 );
    // create manager
    clk = Abc_Clock();
    p = Gia_ManTerCreate( pAig );
    if ( 0 )
    {
        printf( "Obj = %8d (%8d). F = %6d. ", 
            pAig->nObjs, Gia_ManCiNum(pAig) + Gia_ManAndNum(pAig), p->pAig->nFront );
        printf( "AIG = %7.2f MB. F-mem = %7.2f MB. Other = %7.2f MB.  ", 
            12.0*Gia_ManObjNum(p->pAig)/(1<<20), 
            4.0*Abc_BitWordNum(2 * p->pAig->nFront)/(1<<20), 
            4.0*Abc_BitWordNum(2 * (Gia_ManCiNum(pAig) + Gia_ManCoNum(pAig)))/(1<<20) );
        ABC_PRT( "Time", Abc_Clock() - clk );
    }
    // perform simulation
    Gia_ManTerSimInfoInit( p );
    // hash the first state
    pState = Gia_ManTerStateCreate( p );
    Gia_ManTerStateInsert( pState, p->nStateWords, p->pBins, p->nBins );
//Gia_ManTerStatePrint( pState, Gia_ManRegNum(pAig), 0 );
    // perform simuluation till convergence
    pPrev = NULL;
    for ( i = 0; ; i++ )
    {
        Gia_ManTerSimulateRound( p );
        Gia_ManTerSimInfoTransfer( p );
        pState = Gia_ManTerStateCreate( p );
//Gia_ManTerStatePrint( pState, Gia_ManRegNum(pAig), i+1 );
        if ( (pLoop = Gia_ManTerStateLookup(pState, p->nStateWords, p->pBins, p->nBins)) )
        {
            pAig->nTerStates = Vec_PtrSize( p->vStates );
            pAig->nTerLoop = Vec_PtrFind( p->vStates, pLoop );
            break;
        }
        Gia_ManTerStateInsert( pState, p->nStateWords, p->pBins, p->nBins );
        if ( i >= p->nIters && i % 10 == 0 )
        {
            Counter = Gia_ManTerRetire( p, pState, pPrev );
//            Counter = Gia_ManTerRetire2( p, pState );
//            if ( fVerbose )
//                printf( "Retired %d registers.\n", Counter );
        }
        pPrev = pState;
    }
    if ( fVerbose )
    {
        printf( "Ternary simulation saturated after %d iterations. ", i+1 );
        ABC_PRT( "Time", Abc_Clock() - clkTotal );
    }
    return p;
}